

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall cimg_library::CImgDisplay::_map_window(CImgDisplay *this)

{
  Display *pDVar1;
  byte bVar2;
  byte bVar3;
  X11_info *pXVar4;
  XWindowAttributes attr;
  XEvent event;
  
  pXVar4 = cimg::X11_attr();
  pDVar1 = pXVar4->display;
  XMapRaised(pDVar1,this->_window);
  bVar3 = 0;
  bVar2 = 0;
  do {
    XWindowEvent(pDVar1,this->_window,0x28000,&event);
    if (event.type == 0xc) {
      bVar3 = 1;
    }
    else if (event.type == 0x13) {
      bVar2 = 1;
    }
  } while (!(bool)(bVar3 & bVar2));
  do {
    XGetWindowAttributes(pDVar1,this->_window,&attr);
    if (attr.map_state == 2) break;
    XSync(pDVar1,0);
    cimg::sleep(10);
  } while (attr.map_state != 2);
  this->_window_x = attr.x;
  this->_window_y = attr.y;
  return;
}

Assistant:

void _map_window() {
      Display *const dpy = cimg::X11_attr().display;
      bool is_exposed = false, is_mapped = false;
      XWindowAttributes attr;
      XEvent event;
      XMapRaised(dpy,_window);
      do { // Wait for the window to be mapped.
        XWindowEvent(dpy,_window,StructureNotifyMask | ExposureMask,&event);
        switch (event.type) {
        case MapNotify : is_mapped = true; break;
        case Expose : is_exposed = true; break;
        }
      } while (!is_exposed || !is_mapped);
      do { // Wait for the window to be visible.
        XGetWindowAttributes(dpy,_window,&attr);
        if (attr.map_state!=IsViewable) { XSync(dpy,False); cimg::sleep(10); }
      } while (attr.map_state!=IsViewable);
      _window_x = attr.x;
      _window_y = attr.y;
    }